

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_service_interface(t_ocaml_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *os;
  ofstream_with_content_based_conditional_update *os_00;
  int *piVar1;
  ostream *poVar2;
  pointer pptVar3;
  string extends;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  os = &this->f_service_;
  t_generator::indent_abi_cxx11_(&extends,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)os,(string *)&extends);
  poVar2 = std::operator<<(poVar2,"class virtual iface =");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"object (self)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&extends);
  os_00 = &this->f_service_i_;
  t_generator::indent_abi_cxx11_(&extends,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)os_00,(string *)&extends);
  poVar2 = std::operator<<(poVar2,"class virtual iface :");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"object");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&extends);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&extends,this,&tservice->extends_->super_t_type);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar2 = std::operator<<(poVar2,"inherit ");
    poVar2 = std::operator<<(poVar2,(string *)&extends);
    poVar2 = std::operator<<(poVar2,".iface");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = t_generator::indent((t_generator *)this,(ostream *)os_00);
    poVar2 = std::operator<<(poVar2,"inherit ");
    poVar2 = std::operator<<(poVar2,(string *)&extends);
    poVar2 = std::operator<<(poVar2,".iface");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&extends);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  for (pptVar3 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar3 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    function_type_abi_cxx11_(&extends,this,*pptVar3,true,true);
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar2 = std::operator<<((ostream *)os,(string *)&local_b0);
    poVar2 = std::operator<<(poVar2,"method virtual ");
    std::__cxx11::string::string((string *)&local_50,(string *)&(*pptVar3)->name_);
    t_generator::decapitalize(&local_70,(t_generator *)this,&local_50);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = std::operator<<(poVar2,(string *)&extends);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar2 = std::operator<<((ostream *)os_00,(string *)&local_b0);
    poVar2 = std::operator<<(poVar2,"method virtual ");
    std::__cxx11::string::string((string *)&local_90,(string *)&(*pptVar3)->name_);
    t_generator::decapitalize(&local_70,(t_generator *)this,&local_90);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = std::operator<<(poVar2,(string *)&extends);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&extends);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"end");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,(ostream *)os_00);
  poVar2 = std::operator<<(poVar2,"end");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  return;
}

Assistant:

void t_ocaml_generator::generate_service_interface(t_service* tservice) {
  f_service_ << indent() << "class virtual iface =" << endl << "object (self)" << endl;
  f_service_i_ << indent() << "class virtual iface :" << endl << "object" << endl;

  indent_up();

  if (tservice->get_extends() != nullptr) {
    string extends = type_name(tservice->get_extends());
    indent(f_service_) << "inherit " << extends << ".iface" << endl;
    indent(f_service_i_) << "inherit " << extends << ".iface" << endl;
  }

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string ft = function_type(*f_iter, true, true);
    f_service_ << indent() << "method virtual " << decapitalize((*f_iter)->get_name()) << " : "
               << ft << endl;
    f_service_i_ << indent() << "method virtual " << decapitalize((*f_iter)->get_name()) << " : "
                 << ft << endl;
  }
  indent_down();
  indent(f_service_) << "end" << endl << endl;
  indent(f_service_i_) << "end" << endl << endl;
}